

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall
Fl_Text_Buffer::remove_modify_callback
          (Fl_Text_Buffer *this,Fl_Text_Modify_Cb bufModifiedCB,void *cbArg)

{
  uint uVar1;
  Fl_Text_Modify_Cb *pp_Var2;
  void **ppvVar3;
  ulong uVar4;
  Fl_Text_Modify_Cb *pp_Var5;
  void **ppvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  uVar1 = this->mNModifyProcs;
  pp_Var2 = this->mModifyProcs;
  ppvVar3 = this->mCbArgs;
  uVar9 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar4 == uVar9) {
      (*Fl::error)("Fl_Text_Buffer::remove_modify_callback(): Can\'t find modify CB to remove",
                   bufModifiedCB,cbArg,Fl::error);
      return;
    }
    if ((pp_Var2[uVar9] == bufModifiedCB) && (ppvVar3[uVar9] == cbArg)) break;
    uVar9 = uVar9 + 1;
  }
  iVar7 = (int)((long)(int)uVar1 + -1);
  this->mNModifyProcs = iVar7;
  if (iVar7 == 0) {
    this->mNModifyProcs = 0;
    operator_delete__(pp_Var2);
    this->mModifyProcs = (Fl_Text_Modify_Cb *)0x0;
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
    this->mCbArgs = (void **)0x0;
  }
  else {
    uVar4 = ((long)(int)uVar1 + -1) * 8;
    pp_Var5 = (Fl_Text_Modify_Cb *)operator_new__(uVar4);
    ppvVar6 = (void **)operator_new__(uVar4);
    for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
      pp_Var5[uVar4] = pp_Var2[uVar4];
      ppvVar6[uVar4] = ppvVar3[uVar4];
    }
    iVar8 = (int)uVar9;
    if (iVar7 < iVar8) {
      iVar7 = iVar8;
    }
    for (; (uint)((int)uVar4 + (iVar7 - iVar8)) != uVar9; uVar9 = uVar9 + 1) {
      pp_Var5[uVar9] = pp_Var2[uVar9 + 1];
      ppvVar6[uVar9] = ppvVar3[uVar9 + 1];
    }
    operator_delete__(pp_Var2);
    if (this->mCbArgs != (void **)0x0) {
      operator_delete__(this->mCbArgs);
    }
    this->mModifyProcs = pp_Var5;
    this->mCbArgs = ppvVar6;
  }
  return;
}

Assistant:

void Fl_Text_Buffer::remove_modify_callback(Fl_Text_Modify_Cb bufModifiedCB, 
                                            void *cbArg)
{
  int i, toRemove = -1;
  
  /* find the matching callback to remove */
  for (i = 0; i < mNModifyProcs; i++) {
    if (mModifyProcs[i] == bufModifiedCB && mCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_modify_callback(): Can't find modify CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if
   any are left) */
  mNModifyProcs--;
  if (mNModifyProcs == 0) {
    mNModifyProcs = 0;
    delete[]mModifyProcs;
    mModifyProcs = NULL;
    delete[]mCbArgs;
    mCbArgs = NULL;
    return;
  }
  Fl_Text_Modify_Cb *newModifyProcs = new Fl_Text_Modify_Cb[mNModifyProcs];
  void **newCBArgs = new void *[mNModifyProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newModifyProcs[i] = mModifyProcs[i];
    newCBArgs[i] = mCbArgs[i];
  }
  for (; i < mNModifyProcs; i++) {
    newModifyProcs[i] = mModifyProcs[i + 1];
    newCBArgs[i] = mCbArgs[i + 1];
  }
  delete[]mModifyProcs;
  delete[]mCbArgs;
  mModifyProcs = newModifyProcs;
  mCbArgs = newCBArgs;
}